

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_postencode_drop_rtc(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  AV1_COMP *pAVar3;
  int *local_40;
  int enable_postencode_drop;
  AV1_COMP *cpi;
  AV1_PRIMARY *ppi;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  aom_codec_err_t local_4;
  
  pAVar3 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = local_40 + 2;
  }
  iVar2 = *local_40;
  if ((iVar2 < 2) && (-1 < iVar2)) {
    (pAVar3->rc).postencode_drop = iVar2;
    local_4 = AOM_CODEC_OK;
  }
  else {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_postencode_drop_rtc(aom_codec_alg_priv_t *ctx,
                                                    va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  int enable_postencode_drop = CAST(AV1E_SET_POSTENCODE_DROP_RTC, args);
  if (enable_postencode_drop > 1 || enable_postencode_drop < 0)
    return AOM_CODEC_INVALID_PARAM;
  cpi->rc.postencode_drop = enable_postencode_drop;
  return AOM_CODEC_OK;
}